

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>_> *this,TPZCompMesh *mesh,
          TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>_> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  TPZCompMesh *in_RCX;
  void **in_RDX;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid> *in_R8;
  TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>_> *in_stack_ffffffffffffffb8;
  TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>_> *in_stack_ffffffffffffffc0;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *gl2lcElMap_00;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *gl2lcConMap_00;
  
  gl2lcConMap_00 =
       (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)0x0;
  gl2lcElMap_00 =
       (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)0x21;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024fc328);
  TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>::TPZMultiphysicsCompEl
            (in_RSI,in_RDX,in_RCX,in_R8,gl2lcConMap_00,gl2lcElMap_00);
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024fbfe0;
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024fbfe0;
  TPZStack<long,_128>::TPZStack((TPZStack<long,_128> *)in_RDI);
  CopyIntPtIndicesFrom(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh,
                                          const TPZCompElWithMem<TBASE> &copy,
                                          std::map<int64_t,int64_t> & gl2lcConMap,
                                          std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh,copy,gl2lcConMap,gl2lcElMap)
{
    CopyIntPtIndicesFrom(copy);
}